

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

uint __thiscall QPDFObjectHandle::getUIntValueAsUInt(QPDFObjectHandle *this)

{
  ulong uVar1;
  allocator<char> local_29;
  string local_28;
  
  uVar1 = getIntValue(this);
  if ((long)uVar1 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"unsigned integer value request for negative number; returning 0"
               ,&local_29);
    warnIfPossible(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    uVar1 = 0;
  }
  else if (uVar1 >> 0x20 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,
               "requested value of unsigned integer is too big; returning UINT_MAX",&local_29);
    warnIfPossible(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    uVar1 = 0xffffffffffffffff;
  }
  return (uint)uVar1;
}

Assistant:

unsigned int
QPDFObjectHandle::getUIntValueAsUInt() const
{
    long long v = getIntValue();
    if (v < 0) {
        QTC::TC("qpdf", "QPDFObjectHandle uint uint returning 0");
        warnIfPossible("unsigned integer value request for negative number; returning 0");
        return 0;
    } else if (v > UINT_MAX) {
        QTC::TC("qpdf", "QPDFObjectHandle uint returning UINT_MAX");
        warnIfPossible("requested value of unsigned integer is too big; returning UINT_MAX");
        return UINT_MAX;
    } else {
        return static_cast<unsigned int>(v);
    }
}